

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

void gmath::svd<double,3,3>
               (SMatrix<double,_3,_3> *a,SMatrix<double,_3,_3> *u,SVector<double,_3> *w,
               SMatrix<double,_3,_3> *v)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  Matrixd *pMVar7;
  ulong uVar8;
  byte bVar9;
  SMatrix<double,_3,_3> ret;
  Vectord local_a8;
  Matrixd local_98;
  Matrixd local_80;
  Matrixd local_68 [3];
  
  bVar9 = 0;
  local_80.v = (double *)0x0;
  local_80.n = 0;
  local_80.nrows = 0;
  local_80.ncols = 0;
  local_98.v = (double *)0x0;
  local_98.nrows = 0;
  local_98.ncols = 0;
  local_98.n = 0;
  local_a8.n = 0;
  local_a8.v = (double *)0x0;
  local_68[0].nrows = 3;
  local_68[0].ncols = 3;
  local_68[0].n = 9;
  local_68[0].v = (double *)operator_new__(0x48);
  pdVar6 = local_68[0].v;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar6 = a->v[0][0];
    a = (SMatrix<double,_3,_3> *)((long)a + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar6 = pdVar6 + (ulong)bVar9 * -2 + 1;
  }
  svd(local_68,&local_80,&local_a8,&local_98,false);
  if (local_68[0].v != (double *)0x0) {
    operator_delete__(local_68[0].v);
  }
  pdVar6 = local_98.v;
  pdVar5 = local_80.v;
  pMVar7 = local_68;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(double *)pMVar7 = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar9 * -2 + 1;
    pMVar7 = (Matrixd *)((long)pMVar7 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  lVar4 = 0;
  do {
    *(undefined8 *)((long)u->v[0] + lVar4 + 0x10) = *(undefined8 *)((long)&local_68[0].v + lVar4);
    uVar2 = *(undefined8 *)((long)&local_68[0].n + lVar4);
    puVar1 = (undefined8 *)((long)u->v[0] + lVar4);
    *puVar1 = *(undefined8 *)((long)&local_68[0].nrows + lVar4);
    puVar1[1] = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  pdVar5 = local_98.v;
  pMVar7 = local_68;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(double *)pMVar7 = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar9 * -2 + 1;
    pMVar7 = (Matrixd *)((long)pMVar7 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  lVar4 = 0;
  do {
    *(undefined8 *)((long)v->v[0] + lVar4 + 0x10) = *(undefined8 *)((long)&local_68[0].v + lVar4);
    uVar2 = *(undefined8 *)((long)&local_68[0].n + lVar4);
    puVar1 = (undefined8 *)((long)v->v[0] + lVar4);
    *puVar1 = *(undefined8 *)((long)&local_68[0].nrows + lVar4);
    puVar1[1] = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  uVar3 = 3;
  if (local_a8.n < 3) {
    uVar3 = local_a8.n;
  }
  if (0 < (long)local_a8.n) {
    uVar8 = 0;
    do {
      w->v[uVar8] = local_a8.v[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
    if (2 < local_a8.n) goto LAB_00119bca;
  }
  memset(w->v + local_a8.n,0,(ulong)(2 - uVar3) * 8 + 8);
LAB_00119bca:
  if (local_a8.v != (double *)0x0) {
    operator_delete__(local_a8.v);
    pdVar6 = local_98.v;
  }
  if (pdVar6 != (double *)0x0) {
    operator_delete__(pdVar6);
  }
  if (local_80.v != (double *)0x0) {
    operator_delete__(local_80.v);
  }
  return;
}

Assistant:

inline void svd(const SMatrix<T, m, n> &a,
    SMatrix<T, m, m> &u, SVector<T, n> &w, SMatrix<T, n, n> &v)
{
  Matrixd U, V;
  Vectord W;

  svd(a, U, W, V, false);
  u=U; v=V;

  int nn=std::min(w.size(), W.size());

  for (int i=0; i<nn; i++)
  {
    w[i]=W[i];
  }

  for (int i=nn; i < w.size(); i++)
  {
    w[i]=0;
  }
}